

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O1

VRRStep * __thiscall
OSTEI_VRR_Algorithm_Base::Create_Single_
          (VRRStep *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,Quartet *q,
          RRStepType rrstep)

{
  array<int,_4UL> *paVar1;
  Quartet *this_00;
  bool bVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  (*this->_vptr_OSTEI_VRR_Algorithm_Base[2])();
  uVar5 = (__return_storage_ptr__->xyz != STEP_Y) + 1;
  if (__return_storage_ptr__->xyz == STEP_X) {
    uVar5 = 0;
  }
  uVar6 = (ulong)uVar5;
  paVar1 = &__return_storage_ptr__->ijkl;
  (__return_storage_ptr__->ijkl)._M_elems[0] = 0;
  (__return_storage_ptr__->ijkl)._M_elems[1] = 0;
  (__return_storage_ptr__->ijkl)._M_elems[2] = 0;
  (__return_storage_ptr__->ijkl)._M_elems[3] = 0;
  this_00 = (__return_storage_ptr__->src)._M_elems + 2;
  if (rrstep == K) {
    bVar2 = Quartet::operator_cast_to_bool(this_00);
    if ((bVar2) ||
       (bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 3), bVar2))
    {
      (__return_storage_ptr__->ijkl)._M_elems[2] = (q->ket).left.ijk._M_elems[uVar6] + -1;
    }
    bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 4);
    if ((bVar2) ||
       (bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 5), bVar2))
    {
      (__return_storage_ptr__->ijkl)._M_elems[3] = (q->ket).right.ijk._M_elems[uVar6];
    }
    bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 6);
    if (bVar2) {
      paVar1->_M_elems[0] = (q->bra).left.ijk._M_elems[uVar6];
    }
    bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 7);
LAB_0010f55f:
    if (bVar2 == false) {
      return __return_storage_ptr__;
    }
    lVar3 = 0x5f8;
    lVar4 = 0x10;
  }
  else {
    if (rrstep == J) {
      bVar2 = Quartet::operator_cast_to_bool(this_00);
      if ((bVar2) ||
         (bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 3), bVar2)
         ) {
        paVar1->_M_elems[0] = (q->bra).left.ijk._M_elems[uVar6];
      }
      bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 4);
      if ((bVar2) ||
         (bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 5), bVar2)
         ) {
        (__return_storage_ptr__->ijkl)._M_elems[1] = (q->bra).right.ijk._M_elems[uVar6] + -1;
      }
      bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 6);
      if (bVar2) {
        (__return_storage_ptr__->ijkl)._M_elems[2] = (q->ket).left.ijk._M_elems[uVar6];
      }
      bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 7);
    }
    else {
      if (rrstep != I) {
        bVar2 = Quartet::operator_cast_to_bool(this_00);
        if ((bVar2) ||
           (bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 3),
           bVar2)) {
          (__return_storage_ptr__->ijkl)._M_elems[2] = (q->ket).left.ijk._M_elems[uVar6];
        }
        bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 4);
        if ((bVar2) ||
           (bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 5),
           bVar2)) {
          (__return_storage_ptr__->ijkl)._M_elems[3] = (q->ket).right.ijk._M_elems[uVar6] + -1;
        }
        bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 6);
        if (bVar2) {
          paVar1->_M_elems[0] = (q->bra).left.ijk._M_elems[uVar6];
        }
        bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 7);
        goto LAB_0010f55f;
      }
      bVar2 = Quartet::operator_cast_to_bool(this_00);
      if ((bVar2) ||
         (bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 3), bVar2)
         ) {
        paVar1->_M_elems[0] = (q->bra).left.ijk._M_elems[uVar6] + -1;
      }
      bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 4);
      if ((bVar2) ||
         (bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 5), bVar2)
         ) {
        (__return_storage_ptr__->ijkl)._M_elems[1] = (q->bra).right.ijk._M_elems[uVar6];
      }
      bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 6);
      if (bVar2) {
        (__return_storage_ptr__->ijkl)._M_elems[2] = (q->ket).left.ijk._M_elems[uVar6];
      }
      bVar2 = Quartet::operator_cast_to_bool((__return_storage_ptr__->src)._M_elems + 7);
    }
    if (bVar2 == false) {
      return __return_storage_ptr__;
    }
    lVar3 = 0x600;
    lVar4 = 0x50;
  }
  *(undefined4 *)((long)(&(__return_storage_ptr__->target).bra.left + -1) + lVar3) =
       *(undefined4 *)((long)(q->bra).left.ijk._M_elems + uVar6 * 4 + lVar4 + -4);
  return __return_storage_ptr__;
}

Assistant:

VRRStep OSTEI_VRR_Algorithm_Base::Create_Single_(Quartet q, RRStepType rrstep)
{
    VRRStep vs = VRRStep_(q, rrstep);

    // fill in the ijkl members
    int istep = XYZStepToIdx(vs.xyz);
    vs.ijkl = {0, 0, 0, 0};
    if(rrstep == RRStepType::I)
    {
        if(vs.src[2] || vs.src[3])
            vs.ijkl[0] = q.bra.left.ijk[istep]-1;
        if(vs.src[4] || vs.src[5])
            vs.ijkl[1] = q.bra.right.ijk[istep];
        if(vs.src[6])
            vs.ijkl[2] = q.ket.left.ijk[istep];
        if(vs.src[7])
            vs.ijkl[3] = q.ket.right.ijk[istep];
    }
    else if(rrstep == RRStepType::J)
    {
        if(vs.src[2] || vs.src[3])
            vs.ijkl[0] = q.bra.left.ijk[istep];
        if(vs.src[4] || vs.src[5])
            vs.ijkl[1] = q.bra.right.ijk[istep]-1;
        if(vs.src[6])
            vs.ijkl[2] = q.ket.left.ijk[istep];
        if(vs.src[7])
            vs.ijkl[3] = q.ket.right.ijk[istep];
    }
    else if(rrstep == RRStepType::K)
    {
        if(vs.src[2] || vs.src[3])
            vs.ijkl[2] = q.ket.left.ijk[istep]-1;
        if(vs.src[4] || vs.src[5])
            vs.ijkl[3] = q.ket.right.ijk[istep];
        if(vs.src[6])
            vs.ijkl[0] = q.bra.left.ijk[istep];
        if(vs.src[7])
            vs.ijkl[1] = q.bra.right.ijk[istep];
    }
    else
    {
        if(vs.src[2] || vs.src[3])
            vs.ijkl[2] = q.ket.left.ijk[istep];
        if(vs.src[4] || vs.src[5])
            vs.ijkl[3] = q.ket.right.ijk[istep]-1;
        if(vs.src[6])
            vs.ijkl[0] = q.bra.left.ijk[istep];
        if(vs.src[7])
            vs.ijkl[1] = q.bra.right.ijk[istep];
    }

    return vs;
}